

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  VkAllocationCallbacks **this_00;
  RefData<vk::Handle<(vk::HandleType)23>_> data;
  RefData<vk::Handle<(vk::HandleType)23>_> data_00;
  RefData<vk::Handle<(vk::HandleType)23>_> data_01;
  RefData<vk::Handle<(vk::HandleType)23>_> data_02;
  allocator<char> local_311;
  string local_310;
  Move<vk::Handle<(vk::HandleType)23>_> local_2f0;
  RefData<vk::Handle<(vk::HandleType)23>_> local_2d0;
  undefined1 local_2b0 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> obj3;
  RefData<vk::Handle<(vk::HandleType)23>_> local_270;
  undefined1 local_250 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> obj2;
  RefData<vk::Handle<(vk::HandleType)23>_> local_210;
  undefined1 local_1f0 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> obj1;
  Move<vk::Handle<(vk::HandleType)23>_> local_1c0;
  RefData<vk::Handle<(vk::HandleType)23>_> local_1a0;
  undefined1 local_180 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> obj0;
  Resources res;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  this = (Environment *)
         &res.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
          m_allocator;
  local_10 = __return_storage_ptr__;
  Environment::Environment(this,context,4);
  this_00 = &obj0.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  Framebuffer::Resources::Resources
            ((Resources *)this_00,this,(Parameters *)((long)&context_local + 7));
  Framebuffer::create(&local_1c0,this,(Resources *)this_00,(Parameters *)((long)&context_local + 7))
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1a0,(Move *)&local_1c0);
  data.deleter.m_deviceIface = local_1a0.deleter.m_deviceIface;
  data.object.m_internal = local_1a0.object.m_internal;
  data.deleter.m_device = local_1a0.deleter.m_device;
  data.deleter.m_allocator = local_1a0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_180,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_1c0);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)
                      &obj2.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_allocator,
                      (Environment *)
                      &res.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator,
                      (Resources *)
                      &obj0.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_allocator,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_210,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
            );
  data_00.deleter.m_deviceIface = local_210.deleter.m_deviceIface;
  data_00.object.m_internal = local_210.object.m_internal;
  data_00.deleter.m_device = local_210.deleter.m_device;
  data_00.deleter.m_allocator = local_210.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_1f0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)
                      &obj3.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_allocator,
                      (Environment *)
                      &res.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator,
                      (Resources *)
                      &obj0.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_allocator,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_270,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
            );
  data_01.deleter.m_deviceIface = local_270.deleter.m_deviceIface;
  data_01.object.m_internal = local_270.object.m_internal;
  data_01.deleter.m_device = local_270.deleter.m_device;
  data_01.deleter.m_allocator = local_270.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_250,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator);
  Framebuffer::create(&local_2f0,
                      (Environment *)
                      &res.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                       deleter.m_allocator,
                      (Resources *)
                      &obj0.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                       m_allocator,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d0,(Move *)&local_2f0);
  data_02.deleter.m_deviceIface = local_2d0.deleter.m_deviceIface;
  data_02.object.m_internal = local_2d0.object.m_internal;
  data_02.deleter.m_device = local_2d0.deleter.m_device;
  data_02.deleter.m_allocator = local_2d0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_2b0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_2f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_2b0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_250);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_1f0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"Ok",&local_311);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  Framebuffer::Resources::~Resources
            ((Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}